

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2closest_point_query_base.h
# Opt level: O1

void __thiscall
S2ClosestPointQueryBase<S2MinDistance,_int>::FindClosestPointsOptimized
          (S2ClosestPointQueryBase<S2MinDistance,_int> *this)

{
  CellQueue *this_00;
  double dVar1;
  double dVar2;
  bool seek;
  const_reference pQVar3;
  S2CellId id;
  int iVar4;
  QueueEntry entry;
  S2CellId aSStack_150 [2];
  InlinedVector<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry,_16UL,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry>_>
  local_140;
  
  InitQueue(this);
  if (1 < (this->queue_).c.allocator_and_tag_.tag_.size_) {
    this_00 = &this->queue_;
    do {
      pQVar3 = absl::
               InlinedVector<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry,_16UL,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry>_>
               ::front(&this_00->c);
      dVar2 = (pQVar3->distance).super_S1ChordAngle.length2_;
      aSStack_150[0].id_ = (pQVar3->id).id_;
      std::
      priority_queue<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry,_absl::InlinedVector<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry,_16UL,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry>_>,_std::less<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry>_>
      ::pop(this_00);
      dVar1 = (this->distance_limit_).super_S1ChordAngle.length2_;
      if (dVar2 < dVar1) {
        id = S2CellId::child_begin(aSStack_150);
        seek = true;
        iVar4 = 4;
        do {
          seek = ProcessOrEnqueue(this,id,&this->iter_,seek);
          id.id_ = id.id_ + (-id.id_ & id.id_) * 2;
          iVar4 = iVar4 + -1;
        } while (iVar4 != 0);
      }
      else {
        local_140.allocator_and_tag_.tag_.size_ = (Tag)0;
        absl::
        InlinedVector<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry,_16UL,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry>_>
        ::operator=(&this_00->c,&local_140);
        absl::
        InlinedVector<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry,_16UL,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry>_>
        ::clear(&local_140);
      }
    } while ((dVar2 < dVar1) && (1 < (this_00->c).allocator_and_tag_.tag_.size_));
  }
  return;
}

Assistant:

void S2ClosestPointQueryBase<Distance, Data>::FindClosestPointsOptimized() {
  InitQueue();
  while (!queue_.empty()) {
    // We need to copy the top entry before removing it, and we need to remove
    // it before adding any new entries to the queue.
    QueueEntry entry = queue_.top();
    queue_.pop();
    // Work around weird parse error in gcc 4.9 by using a local variable for
    // entry.distance.
    Distance distance = entry.distance;
    if (!(distance < distance_limit_)) {
      queue_ = CellQueue();  // Clear any remaining entries.
      break;
    }
    S2CellId child = entry.id.child_begin();
    // We already know that it has too many points, so process its children.
    // Each child may either be processed directly or enqueued again.  The
    // loop is optimized so that we don't seek unnecessarily.
    bool seek = true;
    for (int i = 0; i < 4; ++i, child = child.next()) {
      seek = ProcessOrEnqueue(child, &iter_, seek);
    }
  }
}